

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrieinp.c
# Opt level: O0

tommy_trie_inplace_node *
tommy_trie_inplace_bucket(tommy_trie_inplace *trie_inplace,tommy_key_t key)

{
  byte bVar1;
  long in_FS_OFFSET;
  bool bVar2;
  tommy_trie_inplace_node *ptStack_28;
  tommy_uint_t shift;
  tommy_trie_inplace_node *node;
  tommy_key_t key_local;
  tommy_trie_inplace *trie_inplace_local;
  
  ptStack_28 = trie_inplace->bucket[key >> 0x1a];
  bVar1 = 0x1a;
  while( true ) {
    bVar2 = false;
    if (ptStack_28 != (tommy_trie_inplace_node *)0x0) {
      bVar2 = ptStack_28->key != key;
    }
    if (!bVar2) break;
    ptStack_28 = ptStack_28->map[key >> (bVar1 & 0x1f) & 3];
    bVar1 = bVar1 - 2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return ptStack_28;
  }
  __stack_chk_fail();
}

Assistant:

tommy_trie_inplace_node* tommy_trie_inplace_bucket(tommy_trie_inplace* trie_inplace, tommy_key_t key)
{
	tommy_trie_inplace_node* node;
	tommy_uint_t shift;

	node = trie_inplace->bucket[key >> TOMMY_TRIE_INPLACE_BUCKET_SHIFT];
	shift = TOMMY_TRIE_INPLACE_BUCKET_SHIFT;

	while (node && node->key != key) {
		node = node->map[(key >> shift) & TOMMY_TRIE_INPLACE_TREE_MASK];
		shift -= TOMMY_TRIE_INPLACE_TREE_BIT;
	}

	return node;
}